

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

double __thiscall
HEkkDual::computeExactDualObjectiveValue(HEkkDual *this,HVector *dual_col,HVector *dual_row)

{
  int iVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  const_reference pvVar10;
  double *pdVar11;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  HighsLogOptions *pHVar12;
  char *pcVar13;
  double dVar14;
  double relative_delta;
  double residual_1;
  double active_value_1;
  double exact_dual_1;
  HighsInt iRow_1;
  HighsInt iVar_1;
  double residual;
  double active_value;
  double exact_dual;
  HighsInt iCol;
  double norm_delta_dual;
  double norm_dual;
  HighsCDouble dual_objective;
  double expected_density;
  bool quad_precision;
  HighsInt numTot;
  double value;
  HighsInt iVar;
  HighsInt iRow;
  HighsSimplexInfo *info;
  SimplexBasis *basis;
  HighsLp *lp;
  HighsTimerClock *in_stack_fffffffffffffec8;
  double in_stack_fffffffffffffed0;
  HVector *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  HVectorBase<double> *in_stack_fffffffffffffef0;
  HighsLogOptions *pHVar15;
  HEkk *in_stack_ffffffffffffff10;
  HVector *in_stack_ffffffffffffff38;
  HVector *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 quad_precision_00;
  HighsSparseMatrix *in_stack_ffffffffffffff50;
  value_type vVar16;
  int local_9c;
  value_type local_90;
  uint local_7c;
  double local_78;
  HighsLogOptions *local_70;
  HighsCDouble local_68;
  undefined8 local_58;
  undefined1 local_4d;
  int local_4c;
  double local_48;
  int local_40;
  int local_3c;
  long local_38;
  vector<int,_std::allocator<int>_> *local_30;
  int *local_28;
  long local_20;
  long local_18;
  
  local_28 = (int *)(*(long *)(in_RDI + 0x10) + 0x2198);
  local_30 = (vector<int,_std::allocator<int>_> *)(*(long *)(in_RDI + 0x10) + 0x2978);
  local_38 = *(long *)(in_RDI + 0x10) + 0x2560;
  local_20 = in_RDX;
  local_18 = in_RSI;
  HVectorBase<double>::setup
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (HighsInt)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  HVectorBase<double>::clear(in_stack_fffffffffffffef0);
  for (local_3c = 0; quad_precision_00 = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38),
      local_3c < local_28[1]; local_3c = local_3c + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_3c);
    local_40 = *pvVar6;
    if (local_40 < *local_28) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_28 + 2),(long)local_40);
      dVar14 = *pvVar7;
      local_48 = dVar14;
      if ((dVar14 != 0.0) || (NAN(dVar14))) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                            (long)local_3c);
        iVar3 = local_3c;
        *pvVar8 = dVar14;
        iVar1 = *(int *)(local_18 + 4);
        *(int *)(local_18 + 4) = iVar1 + 1;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 8),(long)iVar1);
        *pvVar9 = iVar3;
      }
    }
  }
  local_4c = *local_28 + local_28[1];
  HVectorBase<double>::setup
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (HighsInt)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  HVectorBase<double>::clear(in_stack_fffffffffffffef0);
  if (*(int *)(local_18 + 4) != 0) {
    local_4d = 0;
    local_58 = 0x3ff0000000000000;
    HSimplexNla::btran((HSimplexNla *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8
                      );
    HighsSparseMatrix::priceByColumn
              (in_stack_ffffffffffffff50,(bool)quad_precision_00,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,(HighsInt)((ulong)in_RDI >> 0x20));
  }
  HEkk::computeSimplexDualInfeasible(in_stack_ffffffffffffff10);
  if (0 < *(int *)(local_38 + 0x390)) {
    highsLogDev(*(HighsLogOptions **)(local_38 + 0x398),
                (HighsLogType)*(undefined8 *)(local_38 + 0x3a0),
                (char *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),1,
                "When computing exact dual objective, the unperturbed costs yield num / max / sum dual infeasibilities = %d / %g / %g\n"
                ,(ulong)*(uint *)(local_38 + 0x390));
  }
  HighsCDouble::HighsCDouble(&local_68,*(double *)(local_28 + 0x3e));
  local_70 = (HighsLogOptions *)0x0;
  local_78 = 0.0;
  for (local_7c = 0; (int)local_7c < *local_28; local_7c = local_7c + 1) {
    pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                        ((vector<signed_char,_std::allocator<signed_char>_> *)(local_30 + 1),
                         (long)(int)local_7c);
    if (*pvVar10 != '\0') {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_28 + 2),
                          (long)(int)local_7c);
      dVar14 = *pvVar7;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                          (long)(int)local_7c);
      pHVar12 = (HighsLogOptions *)(dVar14 - *pvVar8);
      pdVar11 = (double *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x108);
      if ((double)pHVar12 < *pdVar11 || (double)pHVar12 == *pdVar11) {
        if (-*(double *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x108) <= (double)pHVar12) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_38 + 0x90),
                              (long)(int)local_7c);
          local_90 = *pvVar7;
        }
        else {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_28 + 0xe),
                              (long)(int)local_7c);
          local_90 = *pvVar7;
        }
      }
      else {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_28 + 8),
                            (long)(int)local_7c);
        local_90 = *pvVar7;
      }
      bVar4 = highs_isInfinity(ABS(local_90));
      if (bVar4) {
        return -INFINITY;
      }
      pHVar15 = pHVar12;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_38 + 0x18),
                          (long)(int)local_7c);
      pcVar13 = (char *)ABS((double)pHVar15 - *pvVar7);
      local_70 = (HighsLogOptions *)(ABS((double)pHVar12) + (double)local_70);
      local_78 = (double)pcVar13 + local_78;
      if (10000000000.0 < (double)pcVar13) {
        lVar2 = *(long *)(*(long *)(in_RDI + 0x10) + 8);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_38 + 0x18),
                            (long)(int)local_7c);
        highsLogDev(pHVar12,SUB84(*pvVar7,0),pcVar13,lVar2 + 0x380,4,
                    "Col %4d: ExactDual = %11.4g; WorkDual = %11.4g; Residual = %11.4g\n",
                    (ulong)local_7c);
      }
      HighsCDouble::operator+=
                ((HighsCDouble *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (double)in_stack_fffffffffffffed8);
    }
  }
  local_9c = *local_28;
  do {
    if (local_4c <= local_9c) {
      dVar14 = local_78;
      pdVar11 = std::max<double>((double *)&local_70,(double *)&stack0xffffffffffffff38);
      if (0.001 < dVar14 / *pdVar11) {
        highsLogDev(local_70,SUB84(local_78,0),(char *)(dVar14 / *pdVar11),
                    *(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380,4,
                    "||exact dual vector|| = %g; ||delta dual vector|| = %g: ratio = %g\n");
      }
      dVar14 = HighsCDouble::operator_cast_to_double(&local_68);
      return dVar14;
    }
    pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                        ((vector<signed_char,_std::allocator<signed_char>_> *)(local_30 + 1),
                         (long)local_9c);
    if (*pvVar10 != '\0') {
      uVar5 = local_9c - *local_28;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                          (long)(int)uVar5);
      pHVar12 = (HighsLogOptions *)*pvVar8;
      pdVar11 = (double *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x108);
      if ((double)pHVar12 < *pdVar11 || (double)pHVar12 == *pdVar11) {
        if (-*(double *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x108) <= (double)pHVar12) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_38 + 0x90),
                              (long)local_9c);
          vVar16 = *pvVar7;
        }
        else {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_28 + 0x1a),
                              (long)(int)uVar5);
          vVar16 = *pvVar7;
        }
      }
      else {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_28 + 0x14),
                            (long)(int)uVar5);
        vVar16 = *pvVar7;
      }
      bVar4 = highs_isInfinity(ABS(vVar16));
      if (bVar4) {
        return -INFINITY;
      }
      pHVar15 = pHVar12;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_38 + 0x18),
                          (long)local_9c);
      pcVar13 = (char *)ABS((double)pHVar15 + *pvVar7);
      local_70 = (HighsLogOptions *)(ABS((double)pHVar12) + (double)local_70);
      local_78 = (double)pcVar13 + local_78;
      if (10000000000.0 < (double)pcVar13) {
        in_stack_fffffffffffffed8 = (HVector *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_38 + 0x18),
                            (long)local_9c);
        highsLogDev(pHVar12,SUB84(*pvVar7,0),pcVar13,in_stack_fffffffffffffed8,4,
                    "Row %4d: ExactDual = %11.4g; WorkDual = %11.4g; Residual = %11.4g\n",
                    (ulong)uVar5);
        in_stack_fffffffffffffee4 = uVar5;
      }
      HighsCDouble::operator+=
                ((HighsCDouble *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (double)in_stack_fffffffffffffed8);
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

double HEkkDual::computeExactDualObjectiveValue(HVector& dual_col,
                                                HVector& dual_row) {
  const HighsLp& lp = ekk_instance_.lp_;
  const SimplexBasis& basis = ekk_instance_.basis_;
  const HighsSimplexInfo& info = ekk_instance_.info_;
  // Create a local buffer for the pi vector
  dual_col.setup(lp.num_row_);
  dual_col.clear();
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    HighsInt iVar = basis.basicIndex_[iRow];
    if (iVar < lp.num_col_) {
      const double value = lp.col_cost_[iVar];
      if (value) {
        dual_col.array[iRow] = value;
        dual_col.index[dual_col.count++] = iRow;
      }
    }
  }
  // Create a local buffer for the dual vector
  const HighsInt numTot = lp.num_col_ + lp.num_row_;
  dual_row.setup(lp.num_col_);
  dual_row.clear();
  if (dual_col.count) {
    const bool quad_precision = false;
    const double expected_density = 1;
    simplex_nla->btran(dual_col, expected_density);
    lp.a_matrix_.priceByColumn(quad_precision, dual_row, dual_col);
  }
  // Compute dual infeasibilities
  ekk_instance_.computeSimplexDualInfeasible();
  if (info.num_dual_infeasibilities > 0)
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "When computing exact dual objective, the unperturbed costs "
                "yield num / max / sum dual "
                "infeasibilities = %d / %g / %g\n",
                (int)info.num_dual_infeasibilities, info.max_dual_infeasibility,
                info.sum_dual_infeasibilities);
  HighsCDouble dual_objective = lp.offset_;
  double norm_dual = 0;
  double norm_delta_dual = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (!basis.nonbasicFlag_[iCol]) continue;
    double exact_dual = lp.col_cost_[iCol] - dual_row.array[iCol];
    // The active value must be decided based on the exact dual. For a nonbasic
    // column the bound that must be used may flip due to cost perturbation
    // flipping the sign of its dual and for a basic variable we may need to add
    // to the dual objective using one of the bounds when its dual is not zero.
    double active_value;
    if (exact_dual > ekk_instance_.options_->small_matrix_value)
      active_value = lp.col_lower_[iCol];
    else if (exact_dual < -ekk_instance_.options_->small_matrix_value)
      active_value = lp.col_upper_[iCol];
    else
      active_value = info.workValue_[iCol];

    // when the active value is infinite the dual objective lower bound is
    // -infinity
    if (highs_isInfinity(fabs(active_value))) return -kHighsInf;

    double residual = fabs(exact_dual - info.workDual_[iCol]);
    norm_dual += fabs(exact_dual);
    norm_delta_dual += residual;
    if (residual > 1e10)
      highsLogDev(
          ekk_instance_.options_->log_options, HighsLogType::kWarning,
          "Col %4" HIGHSINT_FORMAT
          ": ExactDual = %11.4g; WorkDual = %11.4g; Residual = %11.4g\n",
          iCol, exact_dual, info.workDual_[iCol], residual);
    dual_objective += active_value * exact_dual;
  }

  for (HighsInt iVar = lp.num_col_; iVar < numTot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) continue;
    HighsInt iRow = iVar - lp.num_col_;
    double exact_dual = dual_col.array[iRow];
    // Similarly to the column case above the active value must be decided based
    // on the exact dual. For a nonbasic row the bound that must be used
    // may flip due to cost perturbation flipping the sign of its dual and for a
    // basic variable we may need to add to the dual objective using one of the
    // bounds when its dual is not zero.
    double active_value;
    if (exact_dual > ekk_instance_.options_->small_matrix_value)
      active_value = lp.row_lower_[iRow];
    else if (exact_dual < -ekk_instance_.options_->small_matrix_value)
      active_value = lp.row_upper_[iRow];
    else
      active_value = -info.workValue_[iVar];

    // when the active value is infinite the dual objective lower bound is
    // -infinity
    if (highs_isInfinity(fabs(active_value))) return -kHighsInf;

    double residual = fabs(exact_dual + info.workDual_[iVar]);
    norm_dual += fabs(exact_dual);
    norm_delta_dual += residual;
    if (residual > 1e10)
      highsLogDev(
          ekk_instance_.options_->log_options, HighsLogType::kWarning,
          "Row %4" HIGHSINT_FORMAT
          ": ExactDual = %11.4g; WorkDual = %11.4g; Residual = %11.4g\n",
          iRow, exact_dual, info.workDual_[iVar], residual);
    dual_objective += active_value * exact_dual;
  }
  double relative_delta = norm_delta_dual / std::max(norm_dual, 1.0);
  if (relative_delta > 1e-3)
    highsLogDev(
        ekk_instance_.options_->log_options, HighsLogType::kWarning,
        "||exact dual vector|| = %g; ||delta dual vector|| = %g: ratio = %g\n",
        norm_dual, norm_delta_dual, relative_delta);
  return double(dual_objective);
}